

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.h
# Opt level: O0

void * tcg_malloc(TCGContext_conflict9 *tcg_ctx,int size)

{
  int size_00;
  uint8_t *puVar1;
  uint8_t *ptr_end;
  uint8_t *ptr;
  TCGContext_conflict9 *s;
  int size_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  size_00 = (size + 7) / 8 << 3;
  tcg_ctx_local = (TCGContext_conflict9 *)tcg_ctx->pool_cur;
  puVar1 = (uint8_t *)((long)&tcg_ctx_local->pool_cur + (long)size_00);
  if (tcg_ctx->pool_end < puVar1) {
    tcg_ctx_local = (TCGContext_conflict9 *)tcg_malloc_internal_tricore(tcg_ctx,size_00);
  }
  else {
    tcg_ctx->pool_cur = puVar1;
  }
  return tcg_ctx_local;
}

Assistant:

static inline void *tcg_malloc(TCGContext *tcg_ctx, int size)
{
    TCGContext *s = tcg_ctx;
    uint8_t *ptr, *ptr_end;

    /* ??? This is a weak placeholder for minimum malloc alignment.  */
    size = QEMU_ALIGN_UP(size, 8);

    ptr = s->pool_cur;
    ptr_end = ptr + size;
    if (unlikely(ptr_end > s->pool_end)) {
        return tcg_malloc_internal(tcg_ctx, size);
    } else {
        s->pool_cur = ptr_end;
        return ptr;
    }
}